

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image.cpp
# Opt level: O0

void compute_integral_img(float *gray_image,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  int i_1;
  int j;
  int i;
  float row_sum;
  int height;
  int width;
  int data_width;
  float *iimage_data;
  integral_image *iimage_local;
  float *gray_image_local;
  
  pfVar4 = iimage->data;
  iVar1 = iimage->data_width;
  iVar2 = iimage->width;
  iVar3 = iimage->height;
  row_sum = 0.0;
  for (i = 0; i < iVar2; i = i + 1) {
    row_sum = gray_image[i] + row_sum;
    pfVar4[i] = row_sum;
  }
  for (j = 1; j < iVar3; j = j + 1) {
    row_sum = 0.0;
    for (i_1 = 0; i_1 < iVar2; i_1 = i_1 + 1) {
      row_sum = gray_image[j * iVar2 + i_1] + row_sum;
      pfVar4[j * iVar1 + i_1] = row_sum + pfVar4[(j + -1) * iVar1 + i_1];
    }
  }
  return;
}

Assistant:

void compute_integral_img(float *gray_image, struct integral_image *iimage) {
    
    float *iimage_data = iimage->data;
    int data_width = iimage->data_width;
    int width = iimage->width;
    int height = iimage->height;

    float row_sum = 0.0f;

    /* sum up the first row */
    for (int i = 0; i < width; ++i) {
        /* previous rows are 0 */
        row_sum += gray_image[i];
        iimage_data[i] = row_sum;
    }

    /* sum all remaining rows*/
    for (int j = 1; j < height; ++j) {
        row_sum = 0.0f;
        for (int i = 0; i < width; ++i) {
            row_sum += gray_image[j * width + i];
            /*add sum of current row until current idx to sum of all previous rows until current index */
            iimage_data[j * data_width + i] = row_sum + iimage_data[(j - 1) * data_width + i];
        }
    }
}